

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O0

ssize_t __thiscall iqxmlrpc::Parser::Impl::read(Impl *this,int __fd,void *__buf,size_t __nbytes)

{
  int type;
  Parse_error *this_00;
  undefined4 in_register_00000034;
  char *local_88;
  undefined4 local_6c;
  ParseStep local_62;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  long local_28;
  xmlErrorPtr err;
  Impl *pIStack_18;
  int code;
  Impl *this_local;
  
  if ((this->pushed_back & 1U) == 0) {
    if (((this->curr).is_empty & 1U) == 0) {
      pIStack_18 = this;
      err._4_4_ = xmlTextReaderRead(this->reader,CONCAT44(in_register_00000034,__fd));
      (this->curr).done = true;
      if (err._4_4_ < 0) {
        local_28 = xmlGetLastError();
        local_5d = 1;
        this_00 = (Parse_error *)__cxa_allocate_exception(0x18);
        if (local_28 == 0) {
          local_88 = "unknown parsing error";
        }
        else {
          local_88 = *(char **)(local_28 + 8);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,local_88,&local_49);
        Parse_error::Parse_error(this_00,&local_48);
        local_5d = 0;
        __cxa_throw(this_00,&Parse_error::typeinfo,Parse_error::~Parse_error);
      }
      if (0 < err._4_4_) {
        type = node_type(this);
        ParseStep::ParseStep(&local_62,type,this->reader);
        (this->curr).done = local_62.done;
        (this->curr).element_begin = local_62.element_begin;
        (this->curr).element_end = local_62.element_end;
        (this->curr).is_empty = local_62.is_empty;
        (this->curr).is_text = local_62.is_text;
      }
      this_local._3_1_ = (this->curr).done;
      this_local._4_1_ = (this->curr).element_begin;
      this_local._5_1_ = (this->curr).element_end;
      this_local._6_1_ = (this->curr).is_empty;
      this_local._7_1_ = (this->curr).is_text;
    }
    else {
      (this->curr).element_begin = false;
      (this->curr).element_end = true;
      (this->curr).is_empty = false;
      this_local._3_1_ = (this->curr).done;
      this_local._4_1_ = (this->curr).element_begin;
      this_local._5_1_ = (this->curr).element_end;
      this_local._6_1_ = (this->curr).is_empty;
      this_local._7_1_ = (this->curr).is_text;
    }
  }
  else {
    this->pushed_back = false;
    this_local._3_1_ = (this->curr).done;
    this_local._4_1_ = (this->curr).element_begin;
    this_local._5_1_ = (this->curr).element_end;
    this_local._6_1_ = (this->curr).is_empty;
    this_local._7_1_ = (this->curr).is_text;
  }
  local_6c = CONCAT31(local_6c._1_3_,this_local._7_1_);
  return CONCAT44(local_6c,this_local._3_4_);
}

Assistant:

ParseStep
  read()
  {
    if (pushed_back) {
      pushed_back = false;
      return curr;
    }

    if (curr.is_empty) {
      curr.element_begin = false;
      curr.element_end = true;
      curr.is_empty = false;
      return curr;
    }

    int code = xmlTextReaderRead(reader);
    curr.done = true;

    if (code < 0) {
      xmlErrorPtr err = xmlGetLastError();
      throw Parse_error(err ? err->message : "unknown parsing error");
    }

    if (code > 0) {
      curr = ParseStep(node_type(), reader);
    }

    return curr;
  }